

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,SubArray *key)

{
  size_t hash;
  char *pcVar1;
  Bucket BVar2;
  QLatin1StringView key_00;
  
  pcVar1 = (key->array).d.ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  key_00.m_data = pcVar1 + key->from;
  key_00.m_size = key->len;
  hash = qHash(key_00,this->seed);
  BVar2 = findBucketWithHash<SubArray>(this,key,hash);
  return BVar2;
}

Assistant:

Bucket findBucket(const K &key) const noexcept
    {
        size_t hash = QHashPrivate::calculateHash(key, seed);
        return findBucketWithHash(key, hash);
    }